

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::bindRenderbuffer(ReferenceContext *this,deUint32 target,deUint32 name)

{
  deBool dVar1;
  Renderbuffer *local_20;
  Renderbuffer *rbo;
  deUint32 name_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  local_20 = (Renderbuffer *)0x0;
  do {
    if (target != 0x8d41) {
      setError(this,0x500);
      return;
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  if ((name != 0) &&
     (local_20 = rc::ObjectManager<sglr::rc::Renderbuffer>::find(&this->m_renderbuffers,name),
     local_20 == (Renderbuffer *)0x0)) {
    local_20 = (Renderbuffer *)operator_new(0x38);
    rc::Renderbuffer::Renderbuffer(local_20,name);
    rc::ObjectManager<sglr::rc::Renderbuffer>::insert(&this->m_renderbuffers,local_20);
  }
  if (this->m_renderbufferBinding != (Renderbuffer *)0x0) {
    rc::ObjectManager<sglr::rc::Renderbuffer>::releaseReference
              (&this->m_renderbuffers,this->m_renderbufferBinding);
  }
  if (local_20 != (Renderbuffer *)0x0) {
    rc::ObjectManager<sglr::rc::Renderbuffer>::acquireReference(&this->m_renderbuffers,local_20);
  }
  this->m_renderbufferBinding = local_20;
  return;
}

Assistant:

void ReferenceContext::bindRenderbuffer (deUint32 target, deUint32 name)
{
	Renderbuffer* rbo = DE_NULL;

	RC_IF_ERROR(target != GL_RENDERBUFFER, GL_INVALID_ENUM, RC_RET_VOID);

	if (name != 0)
	{
		rbo = m_renderbuffers.find(name);
		if (!rbo)
		{
			rbo = new Renderbuffer(name);
			m_renderbuffers.insert(rbo);
		}
	}

	// Remove old reference
	if (m_renderbufferBinding)
		m_renderbuffers.releaseReference(m_renderbufferBinding);

	// Create new reference
	if (rbo)
		m_renderbuffers.acquireReference(rbo);

	m_renderbufferBinding = rbo;
}